

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ClosePopupToLevel(int remaining,_Bool restore_focus_to_window_under_popup)

{
  int *piVar1;
  int iVar2;
  ImGuiPopupData *pIVar3;
  ImGuiWindow *under_this_window;
  ImGuiContext_conflict1 *pIVar4;
  ImGuiPopupData *__dest;
  ImGuiWindow *window;
  uint uVar5;
  ImGuiContext_conflict1 *ctx;
  
  pIVar4 = GImGui;
  if ((remaining < 0) || ((GImGui->OpenPopupStack).Size <= remaining)) {
    __assert_fail("remaining >= 0 && remaining < g.OpenPopupStack.Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x236c,"void ImGui::ClosePopupToLevel(int, bool)");
  }
  pIVar3 = (GImGui->OpenPopupStack).Data;
  under_this_window = pIVar3[(uint)remaining].Window;
  window = pIVar3[(uint)remaining].SourceWindow;
  iVar2 = (GImGui->OpenPopupStack).Capacity;
  if (iVar2 < remaining) {
    if (iVar2 == 0) {
      uVar5 = 8;
    }
    else {
      uVar5 = iVar2 / 2 + iVar2;
    }
    if ((int)uVar5 <= remaining) {
      uVar5 = remaining;
    }
    if (iVar2 < (int)uVar5) {
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiPopupData *)(*GImAllocatorAllocFunc)((ulong)uVar5 * 0x30,GImAllocatorUserData);
      pIVar3 = (pIVar4->OpenPopupStack).Data;
      if (pIVar3 != (ImGuiPopupData *)0x0) {
        memcpy(__dest,pIVar3,(long)(pIVar4->OpenPopupStack).Size * 0x30);
        pIVar3 = (pIVar4->OpenPopupStack).Data;
        if ((pIVar3 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      }
      (pIVar4->OpenPopupStack).Data = __dest;
      (pIVar4->OpenPopupStack).Capacity = uVar5;
    }
  }
  (pIVar4->OpenPopupStack).Size = remaining;
  if (restore_focus_to_window_under_popup) {
    if ((window != (ImGuiWindow *)0x0) &&
       (under_this_window != (ImGuiWindow *)0x0 && window->WasActive == false)) {
      FocusTopMostWindowUnderOne
                ((ImGuiWindow_conflict *)under_this_window,(ImGuiWindow_conflict *)0x0);
      return;
    }
    if ((window != (ImGuiWindow *)0x0) && (pIVar4->NavLayer == ImGuiNavLayer_Main)) {
      window = (ImGuiWindow *)NavRestoreLastChildNavWindow((ImGuiWindow_conflict *)window);
    }
    FocusWindow((ImGuiWindow_conflict *)window);
    return;
  }
  return;
}

Assistant:

void ImGui::ClosePopupToLevel(int remaining, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    IMGUI_DEBUG_LOG_POPUP("ClosePopupToLevel(%d), restore_focus_to_window_under_popup=%d\n", remaining, restore_focus_to_window_under_popup);
    IM_ASSERT(remaining >= 0 && remaining < g.OpenPopupStack.Size);

    // Trim open popup stack
    ImGuiWindow* focus_window = g.OpenPopupStack[remaining].SourceWindow;
    ImGuiWindow* popup_window = g.OpenPopupStack[remaining].Window;
    g.OpenPopupStack.resize(remaining);

    if (restore_focus_to_window_under_popup)
    {
        if (focus_window && !focus_window->WasActive && popup_window)
        {
            // Fallback
            FocusTopMostWindowUnderOne(popup_window, NULL);
        }
        else
        {
            if (g.NavLayer == ImGuiNavLayer_Main && focus_window)
                focus_window = NavRestoreLastChildNavWindow(focus_window);
            FocusWindow(focus_window);
        }
    }
}